

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_archvile.cpp
# Opt level: O2

int AF_A_VileStart(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  DObject *this;
  bool bVar2;
  AActor *ent;
  char *__assertion;
  FSoundID local_1c;
  
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_0051d2e4;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    ent = (AActor *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (ent == (AActor *)0x0) {
LAB_0051d22f:
        ent = (AActor *)0x0;
      }
      else {
        bVar2 = DObject::IsKindOf((DObject *)ent,AActor::RegistrationInfo.MyClass);
        if (!bVar2) {
          __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_0051d2e4;
        }
      }
      if (numparam == 1) goto LAB_0051d2a0;
      VVar1 = param[1].field_0.field_3.Type;
      if (VVar1 != 0xff) {
        if (VVar1 != '\x03') goto LAB_0051d2d4;
        this = (DObject *)param[1].field_0.field_1.a;
        if (param[1].field_0.field_1.atag == 1) {
          if (this != (DObject *)0x0) {
            bVar2 = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass);
            if (!bVar2) {
              __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
              goto LAB_0051d2e4;
            }
          }
        }
        else if (this != (DObject *)0x0) goto LAB_0051d2d4;
      }
      if ((((uint)numparam < 3) || (VVar1 = param[2].field_0.field_3.Type, VVar1 == 0xff)) ||
         ((VVar1 == '\x03' &&
          ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
LAB_0051d2a0:
        local_1c.ID = S_FindSound("vile/start");
        S_Sound(ent,2,&local_1c,1.0,1.0);
        return 0;
      }
      __assertion = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
      ;
      goto LAB_0051d2e4;
    }
    if (ent == (AActor *)0x0) goto LAB_0051d22f;
  }
LAB_0051d2d4:
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_0051d2e4:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_doom/a_archvile.cpp"
                ,0x18,"int AF_A_VileStart(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_VileStart)
{
	PARAM_ACTION_PROLOGUE;
	S_Sound (self, CHAN_VOICE, "vile/start", 1, ATTN_NORM);
	return 0;
}